

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmGhsMultiTargetGenerator::WriteSources(cmGhsMultiTargetGenerator *this,ostream *fout_proj)

{
  _Base_ptr *pp_Var1;
  Types TVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  iterator __position;
  pointer ppcVar5;
  cmGeneratorTarget *pcVar6;
  cmSourceFile *this_00;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  cmGeneratedFileStream **ppcVar7;
  char *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  string *psVar15;
  cmSourceGroup *this_01;
  vector<cmSourceFile*,std::allocator<cmSourceFile*>> *this_02;
  iterator iVar16;
  _Base_ptr p_Var17;
  mapped_type *pmVar18;
  cmValue cVar19;
  ostream *poVar20;
  cmGeneratedFileStream *pcVar21;
  cmCustomCommand *pcVar22;
  long *plVar23;
  cmSourceFileLocation *pcVar24;
  char *extraout_RDX;
  cmSourceFile *sourceFile;
  pointer ppcVar25;
  pointer pbVar26;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  __i;
  ulong uVar27;
  pointer ppcVar28;
  cmGhsMultiTargetGenerator *pcVar29;
  long lVar30;
  cmGeneratedFileStream *fout;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar31;
  string objectName;
  string gname;
  string fext;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupFilesList;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  string lpath;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string fname_1;
  string fpath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  standardGroups;
  string gn;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  groupFiles;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  cmSourceFile *sf;
  _Alloc_hider in_stack_fffffffffffff938;
  _Alloc_hider _Var32;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_stack_fffffffffffff940;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b8 [2];
  _Base_ptr local_698;
  undefined1 local_690 [48];
  _Base_ptr local_660;
  _Base_ptr local_658;
  _Base_ptr local_650 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_640;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_628;
  cmGeneratedFileStream **local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_600;
  _Alloc_hider local_5e8;
  undefined1 local_5e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d0 [2];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_5b0;
  bool local_590;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_588;
  _Base_ptr local_568;
  _Base_ptr local_560;
  undefined1 local_558 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  string local_528;
  string local_508;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  _Base_ptr local_4a8;
  cmGeneratedFileStream *local_4a0;
  string local_498;
  undefined8 local_478;
  undefined8 uStack_470;
  code *local_468;
  undefined8 uStack_460;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_458;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  _Base_ptr local_420;
  _Base_ptr local_418;
  _Base_ptr local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f8;
  undefined1 local_3f0 [16];
  _Base_ptr local_3e0;
  cmGeneratorTarget *pcStack_3d8;
  _Base_ptr local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c8;
  _Alloc_hider local_3c0;
  pointer local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  long *local_3a0 [2];
  long local_390 [55];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  local_1d8;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> local_1a8;
  undefined1 local_190 [352];
  
  local_588.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_588.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_588.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetSourceFiles(this->GeneratorTarget,&local_588,&this->ConfigName);
  local_4a0 = (cmGeneratedFileStream *)fout_proj;
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
            (&local_1a8,&this->Makefile->SourceGroups);
  ppcVar5 = local_588.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d8._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4d8._M_impl.super__Rb_tree_header._M_header;
  local_4d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4d8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_588.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_588.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar25 = local_588.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    do {
      local_190._0_8_ = *ppcVar25;
      pcVar3 = this->Makefile;
      psVar15 = cmSourceFile::ResolveFullPath
                          ((cmSourceFile *)local_190._0_8_,(string *)0x0,(string *)0x0);
      this_01 = cmMakefile::FindSourceGroup(pcVar3,psVar15,&local_1a8);
      psVar15 = cmSourceGroup::GetFullName_abi_cxx11_(this_01);
      pcVar4 = (psVar15->_M_dataplus)._M_p;
      local_440._0_8_ = local_430;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_440,pcVar4,pcVar4 + psVar15->_M_string_length);
      this_02 = (vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                              *)&local_1d8,(key_type *)local_440);
      __position._M_current = *(cmSourceFile ***)(this_02 + 8);
      if (__position._M_current == *(cmSourceFile ***)(this_02 + 0x10)) {
        std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
        _M_realloc_insert<cmSourceFile*const&>(this_02,__position,(cmSourceFile **)local_190);
      }
      else {
        *__position._M_current = (cmSourceFile *)local_190._0_8_;
        *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_4d8,(key_type *)local_440);
      if ((undefined1 *)local_440._0_8_ != local_430) {
        operator_delete((void *)local_440._0_8_,local_430._0_8_ + 1);
      }
      ppcVar25 = ppcVar25 + 1;
    } while (ppcVar25 != ppcVar5);
  }
  local_440._0_8_ = (cmGeneratedFileStream *)local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"CMake Rules","");
  local_420 = (_Base_ptr)&local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"Header Files","");
  local_400 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"Source Files","");
  local_3e0 = (_Base_ptr)&local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"Object Files","");
  local_3c0._M_p = (pointer)&local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Object Libraries","");
  plVar23 = local_390;
  local_3a0[0] = plVar23;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"Resources","");
  __l._M_len = 6;
  __l._M_array = (iterator)local_440;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_458,__l,(allocator_type *)local_190);
  lVar30 = -0xc0;
  do {
    if (plVar23 != (long *)plVar23[-2]) {
      operator_delete((long *)plVar23[-2],*plVar23 + 1);
    }
    plVar23 = plVar23 + -4;
    lVar30 = lVar30 + 0x20;
  } while (lVar30 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_640,local_1d8._M_impl.super__Rb_tree_header._M_node_count,
           (allocator_type *)local_440);
  uVar27 = 0;
  if (local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_458.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar26 = local_458.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&local_4d8,pbVar26);
      iVar14 = (int)uVar27;
      if ((_Rb_tree_header *)iVar16._M_node == &local_4d8._M_impl.super__Rb_tree_header) {
        if ((this->TagType == CUSTOM_TARGET) &&
           (iVar13 = std::__cxx11::string::compare((char *)pbVar26), iVar13 == 0)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&local_640,
                   ((long)local_640.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_640.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
          std::__cxx11::string::_M_assign
                    ((string *)
                     (local_640.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar14));
          goto LAB_002a240d;
        }
      }
      else {
        std::__cxx11::string::_M_assign
                  ((string *)
                   (local_640.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar14));
        pVar31 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::equal_range(&local_4d8,pbVar26);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_aux(&local_4d8,(_Base_ptr)pVar31.first._M_node,(_Base_ptr)pVar31.second._M_node);
LAB_002a240d:
        uVar27 = (ulong)(iVar14 + 1);
      }
      pbVar26 = pbVar26 + 1;
    } while (pbVar26 !=
             local_458.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    uVar27 = (ulong)(int)uVar27;
  }
  local_440._8_8_ = (cmGeneratorTarget *)0x0;
  local_430._0_8_ = local_430._0_8_ & 0xffffffffffffff00;
  local_440._0_8_ = (cmGeneratedFileStream *)local_430;
  iVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&local_4d8,(key_type *)local_440);
  if ((_Rb_tree_header *)iVar16._M_node != &local_4d8._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_assign
              ((string *)
               (local_640.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
    pVar31 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::equal_range(&local_4d8,(key_type *)local_440);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_aux(&local_4d8,(_Base_ptr)pVar31.first._M_node,(_Base_ptr)pVar31.second._M_node);
  }
  if ((cmGeneratedFileStream *)local_440._0_8_ != (cmGeneratedFileStream *)local_430) {
    operator_delete((void *)local_440._0_8_,(ulong)(local_430._0_8_ + 1));
  }
  if ((_Rb_tree_header *)local_4d8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_4d8._M_impl.super__Rb_tree_header) {
    lVar30 = uVar27 << 5;
    p_Var17 = local_4d8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&((local_640.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar30));
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
      lVar30 = lVar30 + 0x20;
    } while ((_Rb_tree_header *)p_Var17 != &local_4d8._M_impl.super__Rb_tree_header);
  }
  pbVar26 = local_640.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  p_Var17 = (_Base_ptr)
            local_640.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_640.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_640.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pmVar18 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                              *)&local_1d8,(key_type *)p_Var17);
      ppcVar5 = (pmVar18->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pmVar18 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                              *)&local_1d8,(key_type *)p_Var17);
      ppcVar25 = (pmVar18->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      if (ppcVar5 != ppcVar25) {
        uVar27 = (long)ppcVar25 - (long)ppcVar5 >> 3;
        lVar30 = 0x3f;
        if (uVar27 != 0) {
          for (; uVar27 >> lVar30 == 0; lVar30 = lVar30 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                  (ppcVar5,ppcVar25,((uint)lVar30 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)ppcVar25 - (long)ppcVar5 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                    (ppcVar5,ppcVar25);
        }
        else {
          ppcVar28 = ppcVar5 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                    (ppcVar5,ppcVar28);
          for (; ppcVar28 != ppcVar25; ppcVar28 = ppcVar28 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                      (ppcVar28);
          }
        }
      }
      p_Var17 = p_Var17 + 1;
    } while (p_Var17 != (_Base_ptr)pbVar26);
    local_608 = (cmGeneratedFileStream **)0x0;
    aStack_600._M_allocated_capacity = 0;
    aStack_600._8_8_ = (cmGeneratedFileStream **)0x0;
    local_4a8 = (_Base_ptr)
                local_640.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_640.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_640.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_698 = (_Base_ptr)
                  local_640.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar6 = this->GeneratorTarget;
        local_440._0_8_ = (cmGeneratedFileStream *)local_430;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_440,"GHS_NO_SOURCE_GROUP_FILE","");
        cVar19 = cmGeneratorTarget::GetProperty(pcVar6,(string *)local_440);
        fout = local_4a0;
        if (cVar19.Value == (string *)0x0) {
LAB_002a26a1:
          pcVar3 = this->Makefile;
          local_190._0_8_ = local_190 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_190,"CMAKE_GHS_NO_SOURCE_GROUP_FILE","");
          bVar12 = cmMakefile::IsOn(pcVar3,(string *)local_190);
          if ((cmSourceFile *)local_190._0_8_ != (cmSourceFile *)(local_190 + 0x10)) {
            operator_delete((void *)local_190._0_8_,CONCAT71(local_190._17_7_,local_190[0x10]) + 1);
          }
        }
        else {
          value._M_str = extraout_RDX;
          value._M_len = (size_t)((cVar19.Value)->_M_dataplus)._M_p;
          bVar11 = cmValue::IsOn((cmValue *)(cVar19.Value)->_M_string_length,value);
          bVar12 = true;
          if (!bVar11) goto LAB_002a26a1;
        }
        if ((cmGeneratedFileStream *)local_440._0_8_ != (cmGeneratedFileStream *)local_430) {
          operator_delete((void *)local_440._0_8_,(ulong)(local_430._0_8_ + 1));
        }
        p_Var17 = local_698->_M_parent;
        if (bVar12 == false) {
          if (p_Var17 != (_Base_ptr)0x0) {
            local_690._0_8_ = local_690 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_690,*(long *)local_698,
                       (long)&p_Var17->_M_color + *(long *)local_698);
            cmsys::SystemTools::ReplaceString((string *)local_690,"\\","_");
            uVar10 = local_690._8_8_;
            uVar9 = local_690._0_8_;
            pcVar8 = cmGlobalGhsMultiGenerator::FILE_EXTENSION;
            local_430._0_8_ = strlen(cmGlobalGhsMultiGenerator::FILE_EXTENSION);
            local_440._0_8_ = uVar10;
            local_440._8_8_ = uVar9;
            local_430._8_8_ = pcVar8;
            views._M_len = 2;
            views._M_array = (iterator)local_440;
            cmCatViews_abi_cxx11_((string *)local_5e0,views);
            pcVar29 = this;
            psVar15 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                                (&this->LocalGenerator->super_cmLocalGenerator);
            pcVar6 = (cmGeneratorTarget *)(psVar15->_M_dataplus)._M_p;
            pcVar4 = (pointer)psVar15->_M_string_length;
            in_stack_fffffffffffff938._M_p = (pointer)0x1;
            in_stack_fffffffffffff940 = local_6b8;
            local_6b8[0]._M_local_buf[0] = '/';
            (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
                      (&local_660,this->LocalGenerator,this->GeneratorTarget);
            local_420 = local_658;
            local_418 = local_660;
            local_190._0_8_ = (cmSourceFile *)0x1;
            local_408 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_190 + 0x10);
            local_190[0x10] = '/';
            local_410 = (_Base_ptr)0x1;
            local_400 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5e0._8_8_;
            local_3f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5e0._0_8_;
            views_00._M_len = 5;
            views_00._M_array = (iterator)local_440;
            local_440._0_8_ = pcVar4;
            local_440._8_8_ = pcVar6;
            local_430._0_8_ = in_stack_fffffffffffff938._M_p;
            local_430._8_8_ = in_stack_fffffffffffff940;
            local_190._8_8_ = local_408;
            cmCatViews_abi_cxx11_(&local_508,views_00);
            this = pcVar29;
            if (local_660 != (_Base_ptr)local_650) {
              operator_delete(local_660,(ulong)((long)&local_650[0]->_M_color + 1));
              this = pcVar29;
            }
            pcVar21 = (cmGeneratedFileStream *)operator_new(0x268);
            cmGeneratedFileStream::cmGeneratedFileStream(pcVar21,&local_508,false,None);
            local_440._0_8_ = pcVar21;
            cmGeneratedFileStream::SetCopyIfDifferent(pcVar21,true);
            if (aStack_600._M_allocated_capacity == aStack_600._8_8_) {
              std::vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>>::
              _M_realloc_insert<cmGeneratedFileStream*const&>
                        ((vector<cmGeneratedFileStream*,std::allocator<cmGeneratedFileStream*>> *)
                         &local_608,(iterator)aStack_600._M_allocated_capacity,
                         (cmGeneratedFileStream **)local_440);
            }
            else {
              *(undefined8 *)aStack_600._M_allocated_capacity = local_440._0_8_;
              aStack_600._M_allocated_capacity = aStack_600._M_allocated_capacity + 8;
            }
            uVar9 = local_440._0_8_;
            cmGlobalGhsMultiGenerator::WriteFileHeader
                      ((cmGlobalGhsMultiGenerator *)
                       (this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator,
                       (ostream *)local_440._0_8_);
            GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)local_440._0_8_);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)fout,(char *)local_5e0._0_8_,local_5e0._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
            GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)fout);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_508._M_dataplus._M_p != &local_508.field_2) {
              operator_delete(local_508._M_dataplus._M_p,
                              CONCAT71(local_508.field_2._M_allocated_capacity._1_7_,
                                       local_508.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e0._0_8_ != local_5d0) {
              operator_delete((void *)local_5e0._0_8_,
                              CONCAT71(local_5d0[0]._M_allocated_capacity._1_7_,
                                       local_5d0[0]._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_690._0_8_ != local_690 + 0x10) {
              operator_delete((void *)local_690._0_8_,local_690._16_8_ + 1);
            }
            fout = (cmGeneratedFileStream *)uVar9;
            if (local_698->_M_parent != (_Base_ptr)0x0) goto LAB_002a2ab0;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)fout,"{comment} Others\n",0x11);
        }
        else if (p_Var17 == (_Base_ptr)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)fout,"{comment} Others",0x10);
          local_440[0] = 10;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,(char *)local_440,1);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"{comment} ",10);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)fout,*(char **)local_698,(long)local_698->_M_parent);
          local_440[0] = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,(char *)local_440,1);
        }
LAB_002a2ab0:
        p_Var17 = local_698;
        iVar14 = std::__cxx11::string::compare((char *)local_698);
        if (iVar14 == 0) {
          local_628.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_628.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_628.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar11 = ComputeCustomCommandOrder(this,&local_628);
          if (bVar11) {
            psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_190,"The custom commands for target [",psVar15);
            plVar23 = (long *)std::__cxx11::string::append((char *)local_190);
            pcVar21 = (cmGeneratedFileStream *)(plVar23 + 2);
            if ((cmGeneratedFileStream *)*plVar23 == pcVar21) {
              local_430._0_8_ =
                   (pcVar21->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   _vptr_basic_ostream;
              local_430._8_8_ = plVar23[3];
              local_440._0_8_ = (cmGeneratedFileStream *)local_430;
            }
            else {
              local_430._0_8_ =
                   (pcVar21->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   _vptr_basic_ostream;
              local_440._0_8_ = (cmGeneratedFileStream *)*plVar23;
            }
            local_440._8_8_ = plVar23[1];
            *plVar23 = (long)pcVar21;
            plVar23[1] = 0;
            *(undefined1 *)(plVar23 + 2) = 0;
            if ((cmSourceFile *)local_190._0_8_ != (cmSourceFile *)(local_190 + 0x10)) {
              operator_delete((void *)local_190._0_8_,CONCAT71(local_190._17_7_,local_190[0x10]) + 1
                             );
            }
            cmSystemTools::Error((string *)local_440);
            if ((cmGeneratedFileStream *)local_440._0_8_ != (cmGeneratedFileStream *)local_430) {
              operator_delete((void *)local_440._0_8_,(ulong)(local_430._0_8_ + 1));
            }
          }
          else {
            p_Var17 = (_Base_ptr)
                      local_628.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_628.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                local_628.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              do {
                pcVar24 = cmSourceFile::GetLocation(*(cmSourceFile **)p_Var17);
                pcVar4 = (this->Name)._M_dataplus._M_p;
                local_440._0_8_ = (cmGeneratedFileStream *)local_430;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_440,pcVar4,pcVar4 + (this->Name)._M_string_length);
                std::__cxx11::string::append((char *)local_440);
                uVar9 = local_440._0_8_;
                pcVar6 = (cmGeneratorTarget *)(pcVar24->Name)._M_string_length;
                if (pcVar6 == (cmGeneratorTarget *)local_440._8_8_) {
                  if (pcVar6 == (cmGeneratorTarget *)0x0) {
                    bVar11 = true;
                  }
                  else {
                    iVar14 = bcmp((pcVar24->Name)._M_dataplus._M_p,(void *)local_440._0_8_,
                                  (size_t)pcVar6);
                    bVar11 = iVar14 == 0;
                  }
                }
                else {
                  bVar11 = false;
                }
                if ((cmGeneratedFileStream *)uVar9 != (cmGeneratedFileStream *)local_430) {
                  operator_delete((void *)uVar9,(ulong)(local_430._0_8_ + 1));
                }
                if (bVar11) {
                  std::_V2::
                  __rotate<__gnu_cxx::__normal_iterator<cmSourceFile_const**,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>>
                            (p_Var17,&p_Var17->_M_parent);
                  break;
                }
                p_Var17 = (_Base_ptr)&p_Var17->_M_parent;
              } while (p_Var17 !=
                       (_Base_ptr)
                       local_628.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            local_660 = (_Base_ptr)local_650;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,".sh","");
            local_5e8._M_p =
                 (pointer)local_628.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            if (local_628.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                local_628.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              iVar14 = 0;
              p_Var17 = (_Base_ptr)
                        local_628.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                pcVar22 = cmSourceFile::GetCustomCommand(*(cmSourceFile **)p_Var17);
                local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
                pcVar4 = (this->ConfigName)._M_dataplus._M_p;
                pcVar29 = this;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_528,pcVar4,pcVar4 + (this->ConfigName)._M_string_length)
                ;
                local_590 = false;
                local_478 = 0;
                uStack_470 = 0;
                local_468 = (code *)0x0;
                uStack_460 = 0;
                computeInternalDepfile.super__Function_base._M_functor._8_8_ = pcVar29;
                computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object =
                     &local_478;
                computeInternalDepfile.super__Function_base._M_manager =
                     (_Manager_type)in_stack_fffffffffffff938._M_p;
                computeInternalDepfile._M_invoker = (_Invoker_type)in_stack_fffffffffffff940;
                cmCustomCommandGenerator::cmCustomCommandGenerator
                          ((cmCustomCommandGenerator *)local_190,pcVar22,&local_528,
                           &this->LocalGenerator->super_cmLocalGenerator,true,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_5b0,computeInternalDepfile);
                if (local_468 != (code *)0x0) {
                  (*local_468)(&local_478,&local_478,3);
                }
                if ((local_590 == true) &&
                   (local_590 = false,
                   local_5b0._M_value._M_dataplus._M_p !=
                   (_Alloc_hider)((long)&local_5b0._M_value + 0x10))) {
                  operator_delete((void *)local_5b0._M_value._M_dataplus._M_p,local_5b0._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_528._M_dataplus._M_p != &local_528.field_2) {
                  operator_delete(local_528._M_dataplus._M_p,
                                  local_528.field_2._M_allocated_capacity + 1);
                }
                psVar15 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                                    (&this->LocalGenerator->super_cmLocalGenerator);
                pcVar6 = (cmGeneratorTarget *)(psVar15->_M_dataplus)._M_p;
                pcVar21 = (cmGeneratedFileStream *)psVar15->_M_string_length;
                local_508._M_dataplus._M_p = (pointer)0x1;
                local_508._M_string_length = (size_type)&local_508.field_2;
                local_508.field_2._M_local_buf[0] = '/';
                (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
                          (&local_568,this->LocalGenerator,this->GeneratorTarget);
                pcVar24 = cmSourceFile::GetLocation(*(cmSourceFile **)p_Var17);
                local_430._0_8_ = local_508._M_dataplus._M_p;
                local_430._8_8_ = local_508._M_string_length;
                local_420 = local_560;
                local_418 = local_568;
                in_stack_fffffffffffff938._M_p = (pointer)0x1;
                in_stack_fffffffffffff940 = local_6b8;
                local_6b8[0]._M_local_buf[0] = '/';
                local_410 = (_Base_ptr)0x1;
                local_3f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(pcVar29->Name)._M_dataplus._M_p;
                local_400 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(pcVar29->Name)._M_string_length;
                local_3f0._0_8_ = 3;
                local_3f0._8_8_ = "_cc";
                local_440._0_8_ = pcVar21;
                local_440._8_8_ = pcVar6;
                local_408 = in_stack_fffffffffffff940;
                cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_690,iVar14);
                local_3e0 = (_Base_ptr)local_690._0_8_;
                pcStack_3d8 = (cmGeneratorTarget *)local_690._8_8_;
                local_5e0._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x1;
                local_5e0._8_8_ = local_5d0;
                local_5d0[0]._M_local_buf[0] = '_';
                local_3d0 = (_Base_ptr)0x1;
                local_3b8 = (pcVar24->Name)._M_dataplus._M_p;
                local_3c0._M_p = (pointer)(pcVar24->Name)._M_string_length;
                local_3b0._M_allocated_capacity = (size_type)local_658;
                local_3b0._8_8_ = local_660;
                views_01._M_len = 10;
                views_01._M_array = (iterator)local_440;
                local_3c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_5e0._8_8_;
                cmCatViews_abi_cxx11_((string *)(local_558 + 0x10),views_01);
                this = pcVar29;
                if (local_568 != (_Base_ptr)local_558) {
                  operator_delete(local_568,local_558._0_8_ + 1);
                  this = pcVar29;
                }
                cmGeneratedFileStream::cmGeneratedFileStream
                          ((cmGeneratedFileStream *)local_440,(string *)(local_558 + 0x10),false,
                           None);
                cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_440,true);
                WriteCustomCommandsHelper
                          (this,(ostream *)local_440,(cmCustomCommandGenerator *)local_190);
                pcVar29 = (cmGhsMultiTargetGenerator *)local_440;
                cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_440);
                WriteCustomCommandLine
                          (pcVar29,(ostream *)fout,(string *)(local_558 + 0x10),
                           (cmCustomCommandGenerator *)local_190);
                cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_440);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_558._16_8_ != &local_538) {
                  operator_delete((void *)local_558._16_8_,local_538._M_allocated_capacity + 1);
                }
                cmCustomCommandGenerator::~cmCustomCommandGenerator
                          ((cmCustomCommandGenerator *)local_190);
                p_Var17 = (_Base_ptr)&p_Var17->_M_parent;
                iVar14 = iVar14 + 1;
              } while (p_Var17 != (_Base_ptr)local_5e8._M_p);
            }
            if (local_660 != (_Base_ptr)local_650) {
              operator_delete(local_660,(ulong)((long)&local_650[0]->_M_color + 1));
            }
          }
          if (this->TagType == CUSTOM_TARGET) {
            WriteBuildEvents(this,(ostream *)fout);
          }
          if ((_Base_ptr)
              local_628.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
            operator_delete(local_628.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_628.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_628.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          pmVar18 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                                  *)&local_1d8,(key_type *)p_Var17);
          p_Var17 = (_Base_ptr)
                    (pmVar18->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          local_5e8._M_p =
               (pointer)(pmVar18->
                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl
                        .super__Vector_impl_data._M_finish;
          if (p_Var17 != (_Base_ptr)local_5e8._M_p) {
            do {
              this_00 = *(cmSourceFile **)p_Var17;
              psVar15 = cmSourceFile::GetFullPath_abi_cxx11_(this_00);
              pcVar4 = (psVar15->_M_dataplus)._M_p;
              local_440._0_8_ = (cmGeneratedFileStream *)local_430;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_440,pcVar4,pcVar4 + psVar15->_M_string_length);
              cmSystemTools::ConvertToOutputSlashes((string *)local_440);
              local_190._0_8_ = local_190 + 0x10;
              local_190._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_190[0x10] = '\0';
              TVar2 = this->TagType;
              if (TVar2 == CUSTOM_TARGET) {
                cmSourceFile::GetLanguage_abi_cxx11_(&local_498,this_00);
                bVar11 = true;
                if (local_498._M_string_length == 0) goto LAB_002a2b7d;
LAB_002a2b91:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_498._M_dataplus._M_p != &local_498.field_2) {
                  operator_delete(local_498._M_dataplus._M_p,
                                  local_498.field_2._M_allocated_capacity + 1);
                }
                if (bVar11) goto LAB_002a2bc4;
LAB_002a2bba:
                bVar11 = false;
              }
              else {
LAB_002a2b7d:
                pcVar22 = cmSourceFile::GetCustomCommand(this_00);
                bVar11 = pcVar22 != (cmCustomCommand *)0x0;
                if (TVar2 == CUSTOM_TARGET) goto LAB_002a2b91;
                if (pcVar22 == (cmCustomCommand *)0x0) goto LAB_002a2bba;
LAB_002a2bc4:
                bVar11 = true;
                std::__cxx11::string::_M_replace
                          ((ulong)local_190,0,(char *)local_190._8_8_,0x696588);
              }
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)fout,(char *)local_190._0_8_,local_190._8_8_);
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar20,(char *)local_440._0_8_,local_440._8_8_);
              WriteObjectLangOverride_abi_cxx11_
                        ((string *)&stack0xfffffffffffff938,(cmGhsMultiTargetGenerator *)this_00,
                         sourceFile);
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar20,in_stack_fffffffffffff938._M_p,
                                   (long)in_stack_fffffffffffff940);
              local_690[0] = 10;
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,local_690,1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_fffffffffffff938._M_p != local_6b8) {
                operator_delete(in_stack_fffffffffffff938._M_p,
                                CONCAT71(local_6b8[0]._M_allocated_capacity._1_7_,
                                         local_6b8[0]._M_local_buf[0]) + 1);
              }
              pp_Var1 = (_Base_ptr *)(local_690 + 0x10);
              if (!bVar11) {
                _Var32._M_p = (pointer)local_6b8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&stack0xfffffffffffff938,"INCLUDE_DIRECTORIES","");
                pcVar29 = (cmGhsMultiTargetGenerator *)local_690;
                local_690._0_8_ = pp_Var1;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_690,"-I","");
                WriteSourceProperty(pcVar29,(ostream *)fout,this_00,
                                    (string *)&stack0xfffffffffffff938,(string *)local_690);
                if ((_Base_ptr *)local_690._0_8_ != pp_Var1) {
                  operator_delete((void *)local_690._0_8_,local_690._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var32._M_p != local_6b8) {
                  operator_delete(_Var32._M_p,
                                  CONCAT71(local_6b8[0]._M_allocated_capacity._1_7_,
                                           local_6b8[0]._M_local_buf[0]) + 1);
                }
                _Var32._M_p = (pointer)local_6b8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&stack0xfffffffffffff938,"COMPILE_DEFINITIONS","");
                pcVar29 = (cmGhsMultiTargetGenerator *)local_690;
                local_690._0_8_ = pp_Var1;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_690,"-D","");
                WriteSourceProperty(pcVar29,(ostream *)fout,this_00,
                                    (string *)&stack0xfffffffffffff938,(string *)local_690);
                if ((_Base_ptr *)local_690._0_8_ != pp_Var1) {
                  operator_delete((void *)local_690._0_8_,local_690._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var32._M_p != local_6b8) {
                  operator_delete(_Var32._M_p,
                                  CONCAT71(local_6b8[0]._M_allocated_capacity._1_7_,
                                           local_6b8[0]._M_local_buf[0]) + 1);
                }
                _Var32._M_p = (pointer)local_6b8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&stack0xfffffffffffff938,"COMPILE_OPTIONS","");
                pcVar29 = (cmGhsMultiTargetGenerator *)local_690;
                local_690._0_8_ = pp_Var1;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_690,"");
                WriteSourceProperty(pcVar29,(ostream *)fout,this_00,
                                    (string *)&stack0xfffffffffffff938,(string *)local_690);
                if ((_Base_ptr *)local_690._0_8_ != pp_Var1) {
                  operator_delete((void *)local_690._0_8_,local_690._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var32._M_p != local_6b8) {
                  operator_delete(_Var32._M_p,
                                  CONCAT71(local_6b8[0]._M_allocated_capacity._1_7_,
                                           local_6b8[0]._M_local_buf[0]) + 1);
                }
                psVar15 = cmGeneratorTarget::GetObjectName_abi_cxx11_(this->GeneratorTarget,this_00)
                ;
                in_stack_fffffffffffff938._M_p = (pointer)local_6b8;
                pcVar4 = (psVar15->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&stack0xfffffffffffff938,pcVar4,
                           pcVar4 + psVar15->_M_string_length);
                if ((in_stack_fffffffffffff940 !=
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0) &&
                   (bVar11 = cmGeneratorTarget::HasExplicitObjectName(this->GeneratorTarget,this_00)
                   , bVar11)) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"    -o ",7);
                  poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)fout,in_stack_fffffffffffff938._M_p,
                                       (long)in_stack_fffffffffffff940);
                  local_690[0] = 10;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar20,local_690,1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)in_stack_fffffffffffff938._M_p != local_6b8) {
                  operator_delete(in_stack_fffffffffffff938._M_p,
                                  CONCAT71(local_6b8[0]._M_allocated_capacity._1_7_,
                                           local_6b8[0]._M_local_buf[0]) + 1);
                }
              }
              if ((cmSourceFile *)local_190._0_8_ != (cmSourceFile *)(local_190 + 0x10)) {
                operator_delete((void *)local_190._0_8_,
                                CONCAT71(local_190._17_7_,local_190[0x10]) + 1);
              }
              if ((cmGeneratedFileStream *)local_440._0_8_ != (cmGeneratedFileStream *)local_430) {
                operator_delete((void *)local_440._0_8_,(ulong)(local_430._0_8_ + 1));
              }
              p_Var17 = (_Base_ptr)&p_Var17->_M_parent;
            } while (p_Var17 != (_Base_ptr)local_5e8._M_p);
          }
        }
        uVar9 = aStack_600._M_allocated_capacity;
        local_698 = local_698 + 1;
        ppcVar7 = local_608;
      } while (local_698 != local_4a8);
      for (; ppcVar7 != (cmGeneratedFileStream **)uVar9; ppcVar7 = ppcVar7 + 1) {
        cmGeneratedFileStream::Close(*ppcVar7);
      }
      if (local_608 != (cmGeneratedFileStream **)0x0) {
        operator_delete(local_608,aStack_600._8_8_ - (long)local_608);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_640);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_458);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_4d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  ::~_Rb_tree(&local_1d8);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&local_1a8);
  if (local_588.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_588.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteSources(std::ostream& fout_proj)
{
  /* vector of all sources for this target */
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);

  /* vector of all groups defined for this target
   * -- but the vector is not expanded with sub groups or in any useful order
   */
  std::vector<cmSourceGroup> sourceGroups = this->Makefile->GetSourceGroups();

  /* for each source file assign it to its group */
  std::map<std::string, std::vector<cmSourceFile*>> groupFiles;
  std::set<std::string> groupNames;
  for (cmSourceFile* sf : sources) {
    cmSourceGroup* sourceGroup =
      this->Makefile->FindSourceGroup(sf->ResolveFullPath(), sourceGroups);
    std::string gn = sourceGroup->GetFullName();
    groupFiles[gn].push_back(sf);
    groupNames.insert(std::move(gn));
  }

  /* list of known groups and the order they are displayed in a project file */
  const std::vector<std::string> standardGroups = {
    "CMake Rules",  "Header Files",     "Source Files",
    "Object Files", "Object Libraries", "Resources"
  };

  /* list of groups in the order they are displayed in a project file*/
  std::vector<std::string> groupFilesList(groupFiles.size());

  /* put the groups in the order they should be listed
   * - standard groups first, and then everything else
   *   in the order used by std::map.
   */
  int i = 0;
  for (const std::string& gn : standardGroups) {
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList[i] = *n;
      i += 1;
      groupNames.erase(gn);
    } else if (this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
               gn == "CMake Rules") {
      /* make sure that rules folder always exists in case of custom targets
       * that have no custom commands except for pre or post build events.
       */
      groupFilesList.resize(groupFilesList.size() + 1);
      groupFilesList[i] = gn;
      i += 1;
    }
  }

  { /* catch-all group - is last item */
    std::string gn;
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList.back() = *n;
      groupNames.erase(gn);
    }
  }

  for (const auto& n : groupNames) {
    groupFilesList[i] = n;
    i += 1;
  }

  /* sort the files within each group */
  for (auto& n : groupFilesList) {
    std::sort(groupFiles[n].begin(), groupFiles[n].end(),
              [](cmSourceFile* l, cmSourceFile* r) {
                return l->ResolveFullPath() < r->ResolveFullPath();
              });
  }

  /* list of open project files */
  std::vector<cmGeneratedFileStream*> gfiles;

  /* write files into the proper project file
   * -- groups go into main project file
   *    unless NO_SOURCE_GROUP_FILE property or variable is set.
   */
  for (auto& sg : groupFilesList) {
    std::ostream* fout;
    bool useProjectFile =
      cmIsOn(this->GeneratorTarget->GetProperty("GHS_NO_SOURCE_GROUP_FILE")) ||
      this->Makefile->IsOn("CMAKE_GHS_NO_SOURCE_GROUP_FILE");
    if (useProjectFile || sg.empty()) {
      fout = &fout_proj;
    } else {
      // Open the filestream in copy-if-different mode.
      std::string gname = sg;
      cmsys::SystemTools::ReplaceString(gname, "\\", "_");
      std::string lpath =
        cmStrCat(gname, cmGlobalGhsMultiGenerator::FILE_EXTENSION);
      std::string fpath = cmStrCat(
        this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
        this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget), '/',
        lpath);
      cmGeneratedFileStream* f = new cmGeneratedFileStream(fpath);
      f->SetCopyIfDifferent(true);
      gfiles.push_back(f);
      fout = f;
      this->GetGlobalGenerator()->WriteFileHeader(*f);
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, *f);
      fout_proj << lpath << " ";
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, fout_proj);
    }

    if (useProjectFile) {
      if (sg.empty()) {
        *fout << "{comment} Others" << '\n';
      } else {
        *fout << "{comment} " << sg << '\n';
      }
    } else if (sg.empty()) {
      *fout << "{comment} Others\n";
    }

    if (sg != "CMake Rules") {
      /* output rule for each source file */
      for (const cmSourceFile* si : groupFiles[sg]) {
        bool compile = true;
        // Convert filename to native system
        // WORKAROUND: GHS MULTI 6.1.4 and 6.1.6 are known to need backslash on
        // windows when opening some files from the search window.
        std::string fname(si->GetFullPath());
        cmSystemTools::ConvertToOutputSlashes(fname);

        /* For custom targets list any associated sources,
         * comment out source code to prevent it from being
         * compiled when processing this target.
         * Otherwise, comment out any custom command (main) dependencies that
         * are listed as source files to prevent them from being considered
         * part of the build.
         */
        std::string comment;
        if ((this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
             !si->GetLanguage().empty()) ||
            si->GetCustomCommand()) {
          comment = "{comment} ";
          compile = false;
        }

        *fout << comment << fname << WriteObjectLangOverride(si) << '\n';
        if (compile) {
          this->WriteSourceProperty(*fout, si, "INCLUDE_DIRECTORIES", "-I");
          this->WriteSourceProperty(*fout, si, "COMPILE_DEFINITIONS", "-D");
          this->WriteSourceProperty(*fout, si, "COMPILE_OPTIONS", "");

          /* to avoid clutter in the GUI only print out the objectName if it
           * has been renamed */
          std::string objectName = this->GeneratorTarget->GetObjectName(si);
          if (!objectName.empty() &&
              this->GeneratorTarget->HasExplicitObjectName(si)) {
            *fout << "    -o " << objectName << '\n';
          }
        }
      }
    } else {
      std::vector<cmSourceFile const*> customCommands;
      if (this->ComputeCustomCommandOrder(customCommands)) {
        std::string message = "The custom commands for target [" +
          this->GeneratorTarget->GetName() + "] had a cycle.\n";
        cmSystemTools::Error(message);
      } else {
        /* Custom targets do not have a dependency on SOURCES files.
         * Therefore the dependency list may include SOURCES files after the
         * custom target. Because nothing can depend on the custom target just
         * move it to the last item.
         */
        for (auto sf = customCommands.begin(); sf != customCommands.end();
             ++sf) {
          if (((*sf)->GetLocation()).GetName() == this->Name + ".rule") {
            std::rotate(sf, sf + 1, customCommands.end());
            break;
          }
        }
        int cmdcount = 0;
#ifdef _WIN32
        std::string fext = ".bat";
#else
        std::string fext = ".sh";
#endif
        for (auto& sf : customCommands) {
          const cmCustomCommand* cc = sf->GetCustomCommand();
          cmCustomCommandGenerator ccg(*cc, this->ConfigName,
                                       this->LocalGenerator);

          // Open the filestream for this custom command
          std::string fname = cmStrCat(
            this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
            this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
            '/', this->Name, "_cc", cmdcount++, '_',
            (sf->GetLocation()).GetName(), fext);

          cmGeneratedFileStream f(fname);
          f.SetCopyIfDifferent(true);
          this->WriteCustomCommandsHelper(f, ccg);
          f.Close();
          this->WriteCustomCommandLine(*fout, fname, ccg);
        }
      }
      if (this->TagType == GhsMultiGpj::CUSTOM_TARGET) {
        this->WriteBuildEvents(*fout);
      }
    }
  }

  for (cmGeneratedFileStream* f : gfiles) {
    f->Close();
  }
}